

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O0

Kit_Edge_t Kit_SopFactorTrivial_rec(Kit_Graph_t *pFForm,uint *pCubes,int nCubes,int nLits)

{
  int nCubes_00;
  Kit_Edge_t eEdge0;
  Kit_Edge_t eEdge1;
  int nCubes2;
  int nCubes1;
  Kit_Edge_t eNode2;
  Kit_Edge_t eNode1;
  int nLits_local;
  int nCubes_local;
  uint *pCubes_local;
  Kit_Graph_t *pFForm_local;
  
  if (nCubes == 1) {
    pFForm_local._4_4_ = Kit_SopFactorTrivialCube_rec(pFForm,*pCubes,0,nLits);
  }
  else {
    nCubes_00 = nCubes / 2;
    eEdge0 = Kit_SopFactorTrivial_rec(pFForm,pCubes,nCubes_00,nLits);
    eEdge1 = Kit_SopFactorTrivial_rec(pFForm,pCubes + nCubes_00,nCubes - nCubes_00,nLits);
    pFForm_local._4_4_ = Kit_GraphAddNodeOr(pFForm,eEdge0,eEdge1);
  }
  return pFForm_local._4_4_;
}

Assistant:

Kit_Edge_t Kit_SopFactorTrivial_rec( Kit_Graph_t * pFForm, unsigned * pCubes, int nCubes, int nLits )
{
    Kit_Edge_t eNode1, eNode2;
    int nCubes1, nCubes2;
    if ( nCubes == 1 )
        return Kit_SopFactorTrivialCube_rec( pFForm, pCubes[0], 0, nLits );
    // split the cubes into two parts
    nCubes1 = nCubes/2;
    nCubes2 = nCubes - nCubes1;
//    nCubes2 = nCubes/2;
//    nCubes1 = nCubes - nCubes2;
    // recursively construct the tree for the parts
    eNode1 = Kit_SopFactorTrivial_rec( pFForm, pCubes,           nCubes1, nLits );
    eNode2 = Kit_SopFactorTrivial_rec( pFForm, pCubes + nCubes1, nCubes2, nLits );
    return Kit_GraphAddNodeOr( pFForm, eNode1, eNode2 );
}